

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count.c
# Opt level: O0

void on_pull(rxc_source_logic *logic,long n)

{
  rxc_source *prVar1;
  rxc_source *prVar2;
  long *element_00;
  long *element;
  rxc_source_count *source;
  rxc_source_logic_count *self;
  long n_local;
  rxc_source_logic *logic_local;
  
  prVar1 = logic->source;
  self = (rxc_source_logic_count *)n;
  while( true ) {
    if ((long)self < 1) {
      return;
    }
    if ((long)prVar1[1].connect <= (long)logic[1].source) break;
    element_00 = (long *)malloc(8);
    prVar2 = logic[1].source;
    logic[1].source = (rxc_source *)((long)&prVar2->dealloc + 1);
    *element_00 = (long)prVar2;
    rxc_outlet_emit(logic->out,element_00);
    self = (rxc_source_logic_count *)((long)&self[-1].count + 7);
  }
  rxc_outlet_complete(logic->out);
  return;
}

Assistant:

static void on_pull(struct rxc_source_logic *logic, long n)
{
    struct rxc_source_logic_count *self = (struct rxc_source_logic_count *) logic;
    struct rxc_source_count *source = (struct rxc_source_count *) logic->source;

    for (; n > 0; n--) {
        if (self->count >= source->to) {
            rxc_outlet_complete(logic->out);
            return;
        }

        long *element = malloc(sizeof(long));
        *element = self->count++;

        rxc_outlet_emit(logic->out, element);
    }
}